

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rprog.c
# Opt level: O2

void entry_prog_ilopheth_flute(ROOM_INDEX_DATA *room,CHAR_DATA *ch)

{
  bool bVar1;
  ROOM_INDEX_DATA *pRVar2;
  ROOM_INDEX_DATA *pRVar3;
  char *pcVar4;
  char *pcVar5;
  CHAR_DATA *arg2;
  CHAR_DATA *ch_00;
  int type;
  CHAR_DATA **ppCVar6;
  char buf [4608];
  
  pRVar2 = get_room_index(0x23a1);
  pRVar3 = get_room_index(0x23a0);
  ppCVar6 = &pRVar2->people;
  while( true ) {
    ch_00 = *ppCVar6;
    if (ch_00 == (CHAR_DATA *)0x0) {
      return;
    }
    bVar1 = is_npc(ch_00);
    if ((bVar1) && (ch_00->pIndexData->vnum == 0x2332)) break;
    ppCVar6 = &ch_00->next_in_room;
  }
  if (pRVar2 == room) {
    pcVar4 = get_char_color(ch,"magenta");
    pcVar5 = END_COLOR(ch);
    sprintf(buf,"%sThe weathered old man ceases his flute-playing and regards you intently.%s",
            pcVar4,pcVar5);
    type = 2;
    arg2 = ch;
  }
  else {
    if (pRVar3 != room) {
      return;
    }
    pcVar4 = get_char_color(ch,"magenta");
    END_COLOR(ch);
    sprintf(buf,
            "%sA haunting melody echoes from the north, its rich tones exuding melancholy and grief.%s"
            ,pcVar4);
    type = 3;
    arg2 = (CHAR_DATA *)0x0;
    ch_00 = ch;
  }
  act(buf,ch_00,(void *)0x0,arg2,type);
  return;
}

Assistant:

void entry_prog_ilopheth_flute(ROOM_INDEX_DATA *room, CHAR_DATA *ch)
{
	ROOM_INDEX_DATA *cliff, *adj;
	CHAR_DATA *man = nullptr, *vch;
	char buf[MSL];

	cliff = get_room_index(9121);
	adj = get_room_index(9120);

	for (vch = cliff->people; vch; vch = vch->next_in_room)
	{
		if (!is_npc(vch))
			continue;
		if (vch->pIndexData->vnum == 9010)
		{
			man = vch;
			break;
		}
	}

	if (!man)
		return;

	if (room == cliff)
	{
		sprintf(buf, "%sThe weathered old man ceases his flute-playing and regards you intently.%s",
			get_char_color(ch, "magenta"),
			END_COLOR(ch));
		act(buf, man, 0, ch, TO_VICT);
	}
	else if (room == adj)
	{
		sprintf(buf, "%sA haunting melody echoes from the north, its rich tones exuding melancholy and grief.%s",
			get_char_color(ch, "magenta"),
			END_COLOR(ch));
		act(buf, ch, 0, 0, TO_CHAR);
	}
}